

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsequentialanimationgroup.cpp
# Opt level: O2

void QSequentialAnimationGroup::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  int iVar2;
  QAbstractAnimation *pQVar3;
  undefined8 *puVar4;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      QSequentialAnimationGroupPrivate::_q_uncontrolledAnimationFinished
                ((QSequentialAnimationGroupPrivate *)(_o->d_ptr).d);
      return;
    }
    if (_id == 0) {
      currentAnimationChanged((QSequentialAnimationGroup *)_o,*_a[1]);
      return;
    }
    break;
  case ReadProperty:
    if (_id == 0) {
      puVar4 = (undefined8 *)*_a;
      pQVar3 = currentAnimation((QSequentialAnimationGroup *)_o);
      *puVar4 = pQVar3;
    }
    break;
  default:
    if (_c == BindableProperty && _id == 0) {
      plVar1 = (long *)*_a;
      *plVar1 = (long)&(_o->d_ptr).d[2].children;
      plVar1[1] = (long)&QtPrivate::
                         QBindableInterfaceForProperty<const_QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>,_void>
                         ::iface;
    }
    break;
  case IndexOfMethod:
    QtMocHelpers::indexOfMethod<void(QSequentialAnimationGroup::*)(QAbstractAnimation*)>
              ((QtMocHelpers *)_a,(void **)currentAnimationChanged,0,0);
    return;
  case RegisterPropertyMetaType:
    if (_id == 0) {
      iVar2 = qMetaTypeId<QAbstractAnimation*>();
      *(int *)*_a = iVar2;
    }
    else {
      *(undefined4 *)*_a = 0xffffffff;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if (_id == 0) {
      puVar4 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractAnimation_*>::metaType;
        return;
      }
    }
    else {
      puVar4 = (undefined8 *)*_a;
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void QSequentialAnimationGroup::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSequentialAnimationGroup *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentAnimationChanged((*reinterpret_cast< std::add_pointer_t<QAbstractAnimation*>>(_a[1]))); break;
        case 1: _t->d_func()->_q_uncontrolledAnimationFinished(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractAnimation* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSequentialAnimationGroup::*)(QAbstractAnimation * )>(_a, &QSequentialAnimationGroup::currentAnimationChanged, 0))
            return;
    }
    if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 0:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QAbstractAnimation* >(); break;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QAbstractAnimation**>(_v) = _t->currentAnimation(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableCurrentAnimation(); break;
        default: break;
        }
    }
}